

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::BaseTimeCoordinator::sendTimingInfo(BaseTimeCoordinator *this)

{
  bool bVar1;
  iterator this_00;
  iterator __args;
  reference pDVar2;
  long in_RDI;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  TimeDependencies *__range1;
  ActionMessage tinfo;
  TimeDependencies *in_stack_fffffffffffffef8;
  ActionMessage *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff18;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffff20;
  ActionMessage local_c0;
  
  ActionMessage::ActionMessage
            ((ActionMessage *)in_stack_ffffffffffffff20._M_current,
             (action_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  local_c0.source_id.gid = *(BaseType *)(in_RDI + 0x48);
  if ((*(byte *)(in_RDI + 0x55) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c0,non_granting_flag);
  }
  if ((*(byte *)(in_RDI + 0x56) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c0,delayed_timing_flag);
  }
  ActionMessage::setExtraData
            (in_stack_ffffffffffffff00,(int32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  this_00 = TimeDependencies::begin(in_stack_fffffffffffffef8);
  __args = TimeDependencies::end(in_stack_fffffffffffffef8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)this_00._M_current,
                       (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)__args._M_current);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar2 = __gnu_cxx::
             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          *)&stack0xffffffffffffff20);
    if ((pDVar2->dependent & 1U) != 0) {
      local_c0.dest_id.gid = (pDVar2->fedID).gid;
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)this_00._M_current,
                 (ActionMessage *)__args._M_current);
    }
    __gnu_cxx::
    __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)&stack0xffffffffffffff20);
  }
  ActionMessage::~ActionMessage((ActionMessage *)this_00._M_current);
  return;
}

Assistant:

void BaseTimeCoordinator::sendTimingInfo()
{
    ActionMessage tinfo(CMD_TIMING_INFO);
    tinfo.source_id = mSourceId;
    if (nonGranting) {
        setActionFlag(tinfo, non_granting_flag);
    }
    if (delayedTiming) {
        setActionFlag(tinfo, delayed_timing_flag);
    }
    tinfo.setExtraData(TIME_COORDINATOR_VERSION);

    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            tinfo.dest_id = dep.fedID;
            sendMessageFunction(tinfo);
        }
    }
}